

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

QSocks5BindData * __thiscall
QSocks5BindStore::retrieve(QSocks5BindStore *this,qintptr socketDescriptor)

{
  QHash<long_long,_QSocks5BindData_*> *this_00;
  Span *pSVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  QSocks5BindData *pQVar5;
  long in_FS_OFFSET;
  const_iterator it;
  char local_60 [24];
  char *local_48;
  qintptr local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &this->mutex;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = socketDescriptor;
  QRecursiveMutex::lock((QRecursiveMutex *)local_38._0_8_);
  local_38[8] = true;
  this_00 = &this->store;
  it = QHash<long_long,_QSocks5BindData_*>::constFindImpl<long_long>(this_00,&local_40);
  if (it.i.d == (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)0x0 && it.i.bucket == 0)
  {
    pQVar5 = (QSocks5BindData *)0x0;
  }
  else {
    pSVar1 = (it.i.d)->spans;
    uVar4 = it.i.bucket >> 7;
    pQVar5 = *(QSocks5BindData **)
              (pSVar1[uVar4].entries[pSVar1[uVar4].offsets[(uint)it.i.bucket & 0x7f]].storage.data +
              8);
    QHash<long_long,_QSocks5BindData_*>::erase(this_00,it);
    if (pQVar5 != (QSocks5BindData *)0x0) {
      lVar2 = QObject::thread();
      lVar3 = QThread::currentThread();
      if (lVar2 != lVar3) {
        local_60[0] = '\x02';
        local_60[1] = '\0';
        local_60[2] = '\0';
        local_60[3] = '\0';
        local_60[0x14] = '\0';
        local_60[0x15] = '\0';
        local_60[0x16] = '\0';
        local_60[0x17] = '\0';
        local_60[4] = '\0';
        local_60[5] = '\0';
        local_60[6] = '\0';
        local_60[7] = '\0';
        local_60[8] = '\0';
        local_60[9] = '\0';
        local_60[10] = '\0';
        local_60[0xb] = '\0';
        local_60[0xc] = '\0';
        local_60[0xd] = '\0';
        local_60[0xe] = '\0';
        local_60[0xf] = '\0';
        local_60[0x10] = '\0';
        local_60[0x11] = '\0';
        local_60[0x12] = '\0';
        local_60[0x13] = '\0';
        local_48 = "default";
        pQVar5 = (QSocks5BindData *)0x0;
        QMessageLogger::warning(local_60,"Cannot access socks5 bind data from different thread");
        goto LAB_0021e5f2;
      }
    }
    if ((this_00->d == (Data *)0x0) || (this_00->d->size == 0)) {
      QBasicTimer::stop();
    }
  }
LAB_0021e5f2:
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QSocks5BindData *QSocks5BindStore::retrieve(qintptr socketDescriptor)
{
    QMutexLocker lock(&mutex);
    const auto it = store.constFind(socketDescriptor);
    if (it == store.cend())
        return nullptr;
    QSocks5BindData *bindData = it.value();
    store.erase(it);
    if (bindData) {
        if (bindData->controlSocket->thread() != QThread::currentThread()) {
            qWarning("Cannot access socks5 bind data from different thread");
            return nullptr;
        }
    } else {
        QSOCKS5_DEBUG << "__ERROR__ binddata == 0";
    }
    // stop the sweep timer if not needed
    if (store.isEmpty())
        sweepTimer.stop();
    return bindData;
}